

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void Con_SaveConfig(IResult *pResult,void *pUserData)

{
  int iVar1;
  undefined4 extraout_var;
  char *format;
  long in_FS_OFFSET;
  char aDate [20];
  char aFilename [128];
  char acStack_b8 [32];
  char local_98 [128];
  long local_18;
  char *pcVar2;
  
  pcVar2 = acStack_b8;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResult->m_NumArgs == 0) {
    str_timestamp(acStack_b8,0x14);
    format = "configs/config_%s.cfg";
  }
  else {
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
    pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
    format = "configs/%s.cfg";
  }
  str_format(local_98,0x80,format,pcVar2);
  (**(code **)(*pUserData + 0x28))(pUserData,local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Con_SaveConfig(IConsole::IResult *pResult, void *pUserData)
{
	char aFilename[128];
	if(pResult->NumArguments())
		str_format(aFilename, sizeof(aFilename), "configs/%s.cfg", pResult->GetString(0));
	else
	{
		char aDate[20];
		str_timestamp(aDate, sizeof(aDate));
		str_format(aFilename, sizeof(aFilename), "configs/config_%s.cfg", aDate);
	}
	((CConfigManager *)pUserData)->Save(aFilename);
}